

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelection::merge(QItemSelection *this,QItemSelection *other,SelectionFlags command)

{
  bool bVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  int i;
  ulong uVar4;
  int t;
  uint uVar5;
  QItemSelectionRange *this_00;
  ulong uVar6;
  long in_FS_OFFSET;
  QItemSelectionRange local_88;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (other->super_QList<QItemSelectionRange>).d.size;
  if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0xe) == 0 || lVar3 == 0) {
LAB_00400014:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  QList<QItemSelectionRange>::reserve((QList<QItemSelectionRange> *)&local_58,lVar3);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QItemSelectionRange *)0x0;
  this_00 = (other->super_QList<QItemSelectionRange>).d.ptr;
  pQVar2 = this_00 + (other->super_QList<QItemSelectionRange>).d.size;
  for (; this_00 != pQVar2; this_00 = this_00 + 1) {
    bVar1 = QItemSelectionRange::isValid(this_00);
    if (bVar1) {
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                ((QList<QItemSelectionRange> *)&local_58,this_00);
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < (ulong)(this->super_QList<QItemSelectionRange>).d.size;
          uVar4 = uVar4 + 1) {
        bVar1 = QItemSelectionRange::intersects
                          (this_00,(QItemSelectionRange *)
                                   ((long)&(((this->super_QList<QItemSelectionRange>).d.ptr)->tl).d
                                   + lVar3));
        if (bVar1) {
          QItemSelectionRange::intersected
                    (&local_88,
                     (QItemSelectionRange *)
                     ((long)&(((this->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar3));
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                    ((QList<QItemSelectionRange> *)&local_78,&local_88);
          QItemSelectionRange::~QItemSelectionRange(&local_88);
        }
        lVar3 = lVar3 + 0x10;
      }
    }
  }
  uVar4 = 0;
LAB_003fff23:
  if (uVar4 < (ulong)local_78.size) {
    uVar5 = 0;
    do {
      uVar6 = (ulong)uVar5;
      while( true ) {
        if ((ulong)(this->super_QList<QItemSelectionRange>).d.size <= uVar6) {
          if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                     super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 8) == 0)
          goto LAB_003fff90;
          uVar5 = 0;
          goto LAB_003fff98;
        }
        bVar1 = QItemSelectionRange::intersects
                          ((this->super_QList<QItemSelectionRange>).d.ptr + uVar6,
                           local_78.ptr + uVar4);
        if (!bVar1) break;
        split((this->super_QList<QItemSelectionRange>).d.ptr + uVar6,local_78.ptr + uVar4,this);
        QList<QItemSelectionRange>::removeAt(&this->super_QList<QItemSelectionRange>,uVar6);
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 4) == 0) {
    QList<QItemSelectionRange>::append
              (&this->super_QList<QItemSelectionRange>,(QList<QItemSelectionRange> *)&local_58);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  goto LAB_00400014;
LAB_003fff98:
  uVar6 = (ulong)uVar5;
  while( true ) {
    if ((ulong)local_58.size <= uVar6) goto LAB_003fff90;
    bVar1 = QItemSelectionRange::intersects(local_58.ptr + uVar6,local_78.ptr + uVar4);
    if (!bVar1) break;
    split(local_58.ptr + uVar6,local_78.ptr + uVar4,(QItemSelection *)&local_58);
    QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_58,uVar6);
  }
  uVar5 = uVar5 + 1;
  goto LAB_003fff98;
LAB_003fff90:
  uVar4 = uVar4 + 1;
  goto LAB_003fff23;
}

Assistant:

void QItemSelection::merge(const QItemSelection &other, QItemSelectionModel::SelectionFlags command)
{
    if (other.isEmpty() ||
          !(command & QItemSelectionModel::Select ||
          command & QItemSelectionModel::Deselect ||
          command & QItemSelectionModel::Toggle))
        return;

    QItemSelection newSelection;
    newSelection.reserve(other.size());
    // Collect intersections
    QItemSelection intersections;
    for (const auto &range : other) {
        if (!range.isValid())
            continue;
        newSelection.push_back(range);
        for (int t = 0; t < size(); ++t) {
            if (range.intersects(at(t)))
                intersections.append(at(t).intersected(range));
        }
    }

    //  Split the old (and new) ranges using the intersections
    for (int i = 0; i < intersections.size(); ++i) { // for each intersection
        for (int t = 0; t < size();) { // splitt each old range
            if (at(t).intersects(intersections.at(i))) {
                split(at(t), intersections.at(i), this);
                removeAt(t);
            } else {
                ++t;
            }
        }
        // only split newSelection if Toggle is specified
        for (int n = 0; (command & QItemSelectionModel::Toggle) && n < newSelection.size();) {
            if (newSelection.at(n).intersects(intersections.at(i))) {
                split(newSelection.at(n), intersections.at(i), &newSelection);
                newSelection.removeAt(n);
            } else {
                ++n;
            }
        }
    }
    // do not add newSelection for Deselect
    if (!(command & QItemSelectionModel::Deselect))
        operator+=(newSelection);
}